

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O1

Iterator * leveldb::NewMergingIterator(Comparator *comparator,Iterator **children,int n)

{
  Iterator *pIVar1;
  long *plVar2;
  ulong uVar3;
  CleanupFunction p_Var4;
  long lVar5;
  
  if (n == 1) {
    pIVar1 = *children;
  }
  else {
    if (n == 0) {
      pIVar1 = NewEmptyIterator();
      return pIVar1;
    }
    pIVar1 = (Iterator *)operator_new(0x50);
    Iterator::Iterator(pIVar1);
    pIVar1->_vptr_Iterator = (_func_int **)&PTR__MergingIterator_00131648;
    pIVar1[1]._vptr_Iterator = (_func_int **)comparator;
    lVar5 = (long)n;
    uVar3 = 0xffffffffffffffff;
    if (-1 < n) {
      uVar3 = lVar5 * 0x20 + 8;
    }
    plVar2 = (long *)operator_new__(uVar3);
    *plVar2 = lVar5;
    p_Var4 = (CleanupFunction)(plVar2 + 1);
    do {
      *(undefined8 *)p_Var4 = 0;
      p_Var4[8] = (code)0x0;
      *(char **)(p_Var4 + 0x10) = "";
      *(undefined8 *)(p_Var4 + 0x18) = 0;
      p_Var4 = p_Var4 + 0x20;
    } while (p_Var4 != (CleanupFunction)(plVar2 + lVar5 * 4 + 1));
    pIVar1[1].cleanup_head_.function = (CleanupFunction)(plVar2 + 1);
    *(int *)&pIVar1[1].cleanup_head_.arg1 = n;
    pIVar1[1].cleanup_head_.arg2 = (void *)0x0;
    *(undefined4 *)&pIVar1[1].cleanup_head_.next = 0;
    if (0 < n) {
      lVar5 = 0;
      do {
        IteratorWrapper::Set
                  ((IteratorWrapper *)(pIVar1[1].cleanup_head_.function + lVar5),*children);
        lVar5 = lVar5 + 0x20;
        children = children + 1;
      } while ((ulong)(uint)n << 5 != lVar5);
    }
  }
  return pIVar1;
}

Assistant:

Iterator* NewMergingIterator(const Comparator* comparator, Iterator** children,
                             int n) {
  assert(n >= 0);
  if (n == 0) {
    return NewEmptyIterator();
  } else if (n == 1) {
    return children[0];
  } else {
    return new MergingIterator(comparator, children, n);
  }
}